

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

void Extra_ThreshCreateInequalities
               (char *pIsop,char *pIsopFneg,int nVars,int *pWofChow,int *pChow,int nChows,
               int nInequalities,unsigned_long **pGreaters,unsigned_long **pSmallers)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int nCubesIsopFneg;
  int nCubesIsop;
  int m;
  int k;
  int j;
  int i;
  int nChows_local;
  int *pChow_local;
  int *pWofChow_local;
  int nVars_local;
  char *pIsopFneg_local;
  char *pIsop_local;
  
  sVar3 = strlen(pIsop);
  iVar1 = (int)(sVar3 / (ulong)(long)(nVars + 3));
  sVar3 = strlen(pIsopFneg);
  iVar2 = (int)(sVar3 / (ulong)(long)(nVars + 3));
  for (nCubesIsop = 0; nCubesIsop < iVar1 * iVar2; nCubesIsop = nCubesIsop + 1) {
    for (k = 0; k < nChows; k = k + 1) {
      pGreaters[nCubesIsop][k] = 0;
      pSmallers[nCubesIsop][k] = 0;
    }
  }
  nCubesIsopFneg = 0;
  k = 0;
  while( true ) {
    sVar3 = strlen(pIsop);
    if ((int)sVar3 <= k) break;
    for (m = 0; m < iVar2; m = m + 1) {
      for (nCubesIsop = 0; nCubesIsop < nVars; nCubesIsop = nCubesIsop + 1) {
        if (pIsop[k + nCubesIsop] == '1') {
          pGreaters[nCubesIsopFneg][pChow[nCubesIsop]] =
               pGreaters[nCubesIsopFneg][pChow[nCubesIsop]] + 1;
        }
      }
      nCubesIsopFneg = nCubesIsopFneg + 1;
    }
    k = nVars + 3 + k;
  }
  nCubesIsopFneg = 0;
  for (k = 0; k < iVar1; k = k + 1) {
    m = 0;
    while( true ) {
      sVar3 = strlen(pIsopFneg);
      if ((int)sVar3 <= m) break;
      for (nCubesIsop = 0; nCubesIsop < nVars; nCubesIsop = nCubesIsop + 1) {
        if (pIsopFneg[m + nCubesIsop] == '-') {
          pSmallers[nCubesIsopFneg][pChow[nCubesIsop]] =
               pSmallers[nCubesIsopFneg][pChow[nCubesIsop]] + 1;
        }
      }
      nCubesIsopFneg = nCubesIsopFneg + 1;
      m = nVars + 3 + m;
    }
  }
  return;
}

Assistant:

void Extra_ThreshCreateInequalities(char * pIsop, char * pIsopFneg, int nVars,
        int * pWofChow, int * pChow, int nChows, int nInequalities,
        unsigned long ** pGreaters, unsigned long ** pSmallers) {
    int i = 0, j = 0, k = 0, m = 0;

    int nCubesIsop = strlen(pIsop) / (nVars + 3);
    int nCubesIsopFneg = strlen(pIsopFneg) / (nVars + 3);

    for (k = 0; k < nCubesIsop * nCubesIsopFneg; k++)
        for (i = 0; i < nChows; i++) {
            pGreaters[k][i] = 0;
            pSmallers[k][i] = 0;
        }
    m = 0;
    for (i = 0; i < (int)strlen(pIsop); i += (nVars + 3))
        for (j = 0; j < nCubesIsopFneg; j++) {
            for (k = 0; k < nVars; k++)
                if (pIsop[i + k] == '1')
                    pGreaters[m][pChow[k]] = pGreaters[m][(pChow[k])] + 1;

            m++;
        }
    m = 0;
    for (i = 0; i < nCubesIsop; i++)
        for (j = 0; j < (int)strlen(pIsopFneg); j += (nVars + 3)) {
            for (k = 0; k < nVars; k++)
                if (pIsopFneg[j + k] == '-')
                    pSmallers[m][pChow[k]] = pSmallers[m][pChow[k]] + 1;
            m++;
        }
//        Extra_ThreshPrintInequalities( pGreaters, pSmallers, nChows, nInequalities);
//        printf( "\nInequalities was Created \n");
}